

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastq_parser_test.cpp
# Opt level: O0

void __thiscall
bioparser::test::BioparserFastqTest_CompressedParseWhole_Test::
~BioparserFastqTest_CompressedParseWhole_Test(BioparserFastqTest_CompressedParseWhole_Test *this)

{
  BioparserFastqTest_CompressedParseWhole_Test *this_local;
  
  ~BioparserFastqTest_CompressedParseWhole_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(BioparserFastqTest, CompressedParseWhole) {
  Setup("sample.fastq.gz");
  s = p->Parse(-1);
  Check();
}